

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void SHA1Final(uchar *digest,SHA1_CTX *context)

{
  uchar local_25;
  uchar local_24 [7];
  uchar c;
  uchar finalcount [8];
  uint i;
  SHA1_CTX *context_local;
  uchar *digest_local;
  
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 8; finalcount._0_4_ = finalcount._0_4_ + 1) {
    local_24[(uint)finalcount._0_4_] =
         (uchar)(context->count[(int)(uint)((uint)finalcount._0_4_ < 4)] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  local_25 = 0x80;
  unique0x1000012d = context;
  SHA1Update(context,&local_25,1);
  while ((stack0xffffffffffffffe8->count[0] & 0x1f8) != 0x1c0) {
    local_25 = '\0';
    SHA1Update(stack0xffffffffffffffe8,&local_25,1);
  }
  SHA1Update(stack0xffffffffffffffe8,local_24,8);
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 0x14; finalcount._0_4_ = finalcount._0_4_ + 1) {
    digest[(uint)finalcount._0_4_] =
         (uchar)(stack0xffffffffffffffe8->state[(uint)finalcount._0_4_ >> 2] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  memset(stack0xffffffffffffffe8,0,0x5c);
  memset(local_24,0,8);
  return;
}

Assistant:

void SHA1Final(unsigned char digest[20], SHA1_CTX* context)
{
    unsigned i;
    unsigned char finalcount[8];
    unsigned char c;

#if 0	/* untested "improvement" by DHR */
    /* Convert context->count to a sequence of bytes
     * in finalcount.  Second element first, but
     * big-endian order within element.
     * But we do it all backwards.
     */
    unsigned char *fcp = &finalcount[8];

    for (i = 0; i < 2; i++)
       {
        uint32_t t = context->count[i];
        int j;

        for (j = 0; j < 4; t >>= 8, j++)
	          *--fcp = (unsigned char) t;
    }
#else
    for (i = 0; i < 8; i++) {
        finalcount[i] = (unsigned char)((context->count[(i >= 4 ? 0 : 1)]
         >> ((3-(i & 3)) * 8) ) & 255);  /* Endian independent */
    }
#endif
    c = 0200;
    SHA1Update(context, &c, 1);
    while ((context->count[0] & 504) != 448) {
	c = 0000;
        SHA1Update(context, &c, 1);
    }
    SHA1Update(context, finalcount, 8);  /* Should cause a SHA1Transform() */
    for (i = 0; i < 20; i++) {
        digest[i] = (unsigned char)
         ((context->state[i>>2] >> ((3-(i & 3)) * 8) ) & 255);
    }
    /* Wipe variables */
    memset(context, '\0', sizeof(*context));
    memset(&finalcount, '\0', sizeof(finalcount));
}